

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtcTimeStampTestCase.cpp
# Opt level: O2

void __thiscall SuiteUtcTimeStampTests::Testcompare::~Testcompare(Testcompare *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(compare)
{
  UtcTimeStamp object;
  object.setHour( 12 );
  object.setMinute( 20 );
  object.setSecond( 10 );
  object.setMillisecond( 10 );

  UtcTimeStamp lesserObject;
  lesserObject.setHour( 12 );
  lesserObject.setMinute( 10 );
  lesserObject.setSecond( 5 );
  lesserObject.setMillisecond( 0 );
  CHECK( lesserObject < object );
  CHECK( lesserObject <= object );
  CHECK( object > lesserObject );
  CHECK( object >= lesserObject );

  UtcTimeStamp greaterObject;
  greaterObject.setHour( 13 );
  greaterObject.setMinute( 10 );
  greaterObject.setSecond( 5 );
  greaterObject.setMillisecond( 0 );
  CHECK( greaterObject > object );
  CHECK( greaterObject >= object );
  CHECK( object < greaterObject );
  CHECK( object <= greaterObject );

  CHECK( object <= object );
  CHECK( object >= object );
  CHECK( object == object );
}